

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgShader.hpp
# Opt level: O0

void __thiscall rsg::ShaderInput::~ShaderInput(ShaderInput *this)

{
  ShaderInput *this_local;
  
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::~vector(&this->m_max);
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::~vector(&this->m_min);
  return;
}

Assistant:

~ShaderInput		(void) {}